

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_fsp.cpp
# Opt level: O3

void * __thiscall ON_FixedSizePool::ThreadSafeAllocateElement(ON_FixedSizePool *this)

{
  bool bVar1;
  void *__s;
  
  bVar1 = ON_SleepLock::GetLock(&this->m_sleep_lock);
  if (bVar1) {
    __s = AllocateDirtyElement(this);
    if (__s != (void *)0x0) {
      memset(__s,0,this->m_sizeof_element);
    }
    ON_SleepLock::ReturnLock(&this->m_sleep_lock);
  }
  else {
    __s = (void *)0x0;
  }
  return __s;
}

Assistant:

void* ON_FixedSizePool::ThreadSafeAllocateElement()
{
  void* p = nullptr;
  {
    if ( m_sleep_lock.GetLock() )
    {
      p = AllocateElement();
      m_sleep_lock.ReturnLock();
    }
  }
  return p;
}